

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O3

path * __thiscall mp::path::filename(path *__return_storage_ptr__,path *this)

{
  pointer pcVar1;
  long lVar2;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  lVar2 = std::__cxx11::string::rfind((char)this,0x2f);
  if (lVar2 == -1) {
    (__return_storage_ptr__->str_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_).field_2;
    pcVar1 = (this->str_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->str_)._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
    (__return_storage_ptr__->str_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_38,local_30 + (long)local_38);
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

path filename() const {
    size_t last_sep = FindLastSep();
    return last_sep == std::string::npos ?
        *this : path(str_.substr(last_sep + 1));
  }